

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

_Bool mul_u16n(uint16_t *r,uint16_t *a,uint16_t *b,size_t nr,size_t na,size_t nb)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint16_t *puVar10;
  uint16_t *puVar11;
  uint uVar12;
  size_t sVar13;
  
  zer_u16n(r,nr);
  puVar10 = r + -2;
  sVar4 = 1;
  _Var3 = false;
  sVar8 = na;
  do {
    if (sVar8 == 0) {
      return _Var3;
    }
    sVar9 = sVar4;
    puVar11 = puVar10;
    sVar13 = nb;
    while (sVar13 != 0) {
      uVar5 = (nb - sVar13) + (na - sVar8);
      if (nr <= uVar5) {
        _Var3 = true;
        break;
      }
      lVar6 = ~uVar5 + nr;
      uVar1 = a[sVar8 - 1];
      uVar2 = b[sVar13 - 1];
      uVar12 = ((uint)uVar2 * (uint)uVar1 & 0xffff) + (uint)r[lVar6];
      r[lVar6] = (uint16_t)uVar12;
      sVar7 = nr;
      for (uVar12 = (uVar12 >> 0x10) + ((uint)uVar2 * (uint)uVar1 >> 0x10); uVar12 != 0;
          uVar12 = uVar12 + uVar1 >> 0x10) {
        if (sVar9 == sVar7) {
          _Var3 = true;
          break;
        }
        uVar1 = puVar11[sVar7];
        puVar11[sVar7] = (uint16_t)(uVar12 + uVar1);
        sVar7 = sVar7 - 1;
      }
      puVar11 = puVar11 + -1;
      sVar9 = sVar9 + 1;
      sVar13 = sVar13 - 1;
    }
    puVar10 = puVar10 + -1;
    sVar4 = sVar4 + 1;
    sVar8 = sVar8 - 1;
  } while( true );
}

Assistant:

static bool mul_u16n(uint16_t *r, const uint16_t *a, const uint16_t *b,
		size_t nr, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	size_t ia = na;
	bool over = false;

	zer_u16n(r, nr);
	while (ia > 0) {
		size_t ib = nb;

		--ia;
		while (ib > 0) {
			size_t rir = (na - 1 - ia) + (nb - ib), ir;
			uint32_t p, carry, t;

			if (rir >= nr) {
				over = true;
				break;
			}
			--ib;
			ir = (nr - rir) - 1;
			p = (uint32_t)a[ia] * (uint32_t)b[ib];
			carry = p >> 16;
			t = (uint32_t)r[ir] + (p & mask);
			r[ir] = t & mask;
			carry += t >> 16;
			while (carry > 0) {
				if (ir == 0) {
					over = true;
					break;
				}
				--ir;
				t = (uint32_t)r[ir] + carry;
				r[ir] = t & mask;
				carry = t >> 16;
			}
		}
	}
	return over;
}